

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline *outline)

{
  short sVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  
  if (outline != (SW_FT_Outline *)0x0) {
    sVar1 = outline->n_points;
    sVar2 = outline->n_contours;
    if (sVar1 == 0 && sVar2 == 0) {
      return 0;
    }
    if (0 < sVar2 && 0 < sVar1) {
      lVar6 = 0;
      iVar5 = -1;
      while (sVar2 != lVar6) {
        sVar3 = outline->contours[lVar6];
        if (sVar1 <= sVar3) {
          return -1;
        }
        lVar6 = lVar6 + 1;
        bVar4 = sVar3 <= iVar5;
        iVar5 = (int)sVar3;
        if (bVar4) {
          return -1;
        }
      }
      if (iVar5 == sVar1 + -1) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

SW_FT_Error SW_FT_Outline_Check(SW_FT_Outline* outline)
{
    if (outline) {
        SW_FT_Int n_points = outline->n_points;
        SW_FT_Int n_contours = outline->n_contours;
        SW_FT_Int end0, end;
        SW_FT_Int n;

        /* empty glyph? */
        if (n_points == 0 && n_contours == 0) return 0;

        /* check point and contour counts */
        if (n_points <= 0 || n_contours <= 0) goto Bad;

        end0 = end = -1;
        for (n = 0; n < n_contours; n++) {
            end = outline->contours[n];

            /* note that we don't accept empty contours */
            if (end <= end0 || end >= n_points) goto Bad;

            end0 = end;
        }

        if (end != n_points - 1) goto Bad;

        /* XXX: check the tags array */
        return 0;
    }

Bad:
    return -1;  // SW_FT_THROW( Invalid_Argument );
}